

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rendering.cpp
# Opt level: O2

void __thiscall duckdb::Linenoise::RefreshMultiLine(Linenoise *this)

{
  int fd;
  pointer psVar1;
  ulong uVar2;
  Linenoise *pLVar3;
  bool bVar4;
  int iVar5;
  size_t sVar6;
  char *render_end;
  ulong uVar7;
  long lVar8;
  int iVar9;
  int iVar10;
  char *len;
  searchMatch *match;
  vector<duckdb::highlightToken,_true> *in_stack_fffffffffffffea8;
  allocator local_145;
  int rows;
  Linenoise *local_140;
  int new_cursor_row;
  Highlighting *local_130;
  allocator local_128 [36];
  int new_cursor_x;
  char *local_100;
  int local_f4;
  AppendBuffer append_buffer;
  vector<duckdb::highlightToken,_true> tokens;
  string highlight_buffer;
  int cols;
  char seq [64];
  
  if (this->render != true) {
    return;
  }
  local_f4 = GetPromptWidth(this);
  PositionToColAndRow(this,this->pos,&new_cursor_row,&new_cursor_x,&rows,&cols);
  uVar7 = this->maxrows;
  uVar2 = uVar7;
  if (uVar7 == 0) {
    uVar2 = 1;
  }
  iVar5 = (int)uVar2;
  fd = this->ofd;
  highlight_buffer._M_dataplus._M_p = (pointer)&highlight_buffer.field_2;
  highlight_buffer._M_string_length = 0;
  highlight_buffer.field_2._M_local_buf[0] = '\0';
  if (this->clear_screen == true) {
    this->old_cursor_rows = 0;
    this->clear_screen = false;
    iVar5 = 0;
  }
  local_130 = (Highlighting *)this->buf;
  iVar10 = (this->ws).ws_row;
  local_140 = this;
  if (rows <= iVar10) {
    render_end = (char *)this->len;
    this->y_scroll = 0;
    sVar6 = 0;
    len = render_end;
    goto LAB_001f25d8;
  }
  sVar6 = this->y_scroll;
  if ((int)sVar6 < new_cursor_row) {
    if (iVar10 + (int)sVar6 < new_cursor_row) {
      iVar9 = new_cursor_row - iVar10;
      goto LAB_001f2538;
    }
  }
  else {
    iVar9 = new_cursor_row + -1;
LAB_001f2538:
    sVar6 = (size_t)iVar9;
    this->y_scroll = sVar6;
  }
  if (sVar6 == 0) {
    iVar9 = 0;
    sVar6 = 0;
  }
  else {
    sVar6 = ColAndRowToPosition(this,(int)sVar6,0);
    iVar9 = (int)this->y_scroll;
    iVar10 = (this->ws).ws_row;
  }
  pLVar3 = local_140;
  if (iVar10 + iVar9 < rows) {
    render_end = (char *)ColAndRowToPosition(local_140,iVar10 + iVar9,99999);
    iVar9 = (int)pLVar3->y_scroll;
  }
  else {
    render_end = (char *)local_140->len;
  }
  new_cursor_row = new_cursor_row - iVar9;
  ::std::__cxx11::string::string
            ((string *)&append_buffer,"truncate to rows %d - %d (render bytes %d to %d)",local_128);
  local_130 = local_130 + sVar6;
  ::std::__cxx11::string::~string((string *)&append_buffer);
  rows = (local_140->ws).ws_row;
  uVar7 = (ulong)(uint)local_140->maxrows;
  len = render_end + -sVar6;
LAB_001f25d8:
  if ((int)uVar7 < rows) {
    local_140->maxrows = (long)rows;
  }
  tokens.super_vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>.
  super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  tokens.super_vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>.
  super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  tokens.super_vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>.
  super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bVar4 = Highlighting::IsEnabled();
  pLVar3 = local_140;
  if (bVar4) {
    psVar1 = (local_140->search_matches).
             super__Vector_base<duckdb::searchMatch,_std::allocator<duckdb::searchMatch>_>._M_impl.
             super__Vector_impl_data._M_start;
    match = (searchMatch *)0x0;
    if (local_140->search_index <
        (ulong)(((long)(local_140->search_matches).
                       super__Vector_base<duckdb::searchMatch,_std::allocator<duckdb::searchMatch>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)psVar1) / 0x18)) {
      match = psVar1 + local_140->search_index;
    }
    local_100 = (char *)sVar6;
    Highlighting::Tokenize
              ((vector<duckdb::highlightToken,_true> *)&append_buffer,(char *)local_130,(size_t)len,
               *local_140->buf == '.',match);
    ::std::vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>::_M_move_assign
              (&tokens.super_vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>
               ,&append_buffer);
    ::std::_Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>::
    ~_Vector_base((_Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_> *)
                  &append_buffer);
    AddErrorHighlighting
              (pLVar3,(idx_t)local_100,(idx_t)render_end,
               (vector<duckdb::highlightToken,_true> *)
               &tokens.super_vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>
              );
    bVar4 = AddCompletionMarker(pLVar3,(char *)local_130,(idx_t)len,&highlight_buffer,&tokens);
    if (bVar4) {
      local_130 = (Highlighting *)highlight_buffer._M_dataplus._M_p;
      len = (char *)highlight_buffer._M_string_length;
    }
  }
  if (1 < rows) {
    in_stack_fffffffffffffea8 = &tokens;
    AddContinuationMarkers_abi_cxx11_
              (&append_buffer.buffer,local_140,(char *)local_130,(size_t)len,local_f4,
               (new_cursor_row + 1) - (uint)(local_140->y_scroll == 0),in_stack_fffffffffffffea8);
    ::std::__cxx11::string::operator=((string *)&highlight_buffer,(string *)&append_buffer);
    ::std::__cxx11::string::~string((string *)&append_buffer);
    len = (char *)highlight_buffer._M_string_length;
    local_130 = (Highlighting *)highlight_buffer._M_dataplus;
  }
  local_100 = len;
  bVar4 = Utf8Proc::IsValid((char *)local_130,(size_t)len);
  if ((bVar4) && (bVar4 = Highlighting::IsEnabled(), bVar4)) {
    Highlighting::HighlightText_abi_cxx11_
              (&append_buffer.buffer,local_130,local_100,0,(size_t)local_100,(size_t)&tokens,
               in_stack_fffffffffffffea8);
    ::std::__cxx11::string::operator=((string *)&highlight_buffer,(string *)&append_buffer);
    ::std::__cxx11::string::~string((string *)&append_buffer);
    local_130 = (Highlighting *)highlight_buffer._M_dataplus._M_p;
    local_100 = (char *)highlight_buffer._M_string_length;
  }
  append_buffer.buffer._M_dataplus._M_p = (pointer)&append_buffer.buffer.field_2;
  append_buffer.buffer._M_string_length = 0;
  append_buffer.buffer.field_2._M_local_buf[0] = '\0';
  if (local_140->old_cursor_rows != (long)iVar5) {
    ::std::__cxx11::string::string((string *)local_128,"go down %d",&local_145);
    ::std::__cxx11::string::~string((string *)local_128);
    snprintf(seq,0x40,"\x1b[%dB",(ulong)(uint)(iVar5 - (int)local_140->old_cursor_rows));
    ::std::__cxx11::string::append((char *)&append_buffer);
  }
  iVar10 = 1;
  if (1 < iVar5) {
    iVar10 = iVar5;
  }
  while (iVar10 = iVar10 + -1, iVar10 != 0) {
    ::std::__cxx11::string::string((string *)local_128,"clear+up",&local_145);
    ::std::__cxx11::string::~string((string *)local_128);
    ::std::__cxx11::string::append((char *)&append_buffer);
  }
  ::std::__cxx11::string::string((string *)local_128,"clear",&local_145);
  ::std::__cxx11::string::~string((string *)local_128);
  ::std::__cxx11::string::append((char *)&append_buffer);
  if (local_140->y_scroll == 0) {
    ::std::__cxx11::string::append((char *)&append_buffer);
  }
  ::std::__cxx11::string::append((char *)&append_buffer,(ulong)local_130);
  RefreshShowHints(local_140,&append_buffer,local_f4);
  ::std::__cxx11::string::string((string *)local_128,"pos > 0 %d",&local_145);
  ::std::__cxx11::string::~string((string *)local_128);
  ::std::__cxx11::string::string((string *)local_128,"pos == len %d",&local_145);
  pLVar3 = local_140;
  ::std::__cxx11::string::~string((string *)local_128);
  ::std::__cxx11::string::string((string *)local_128,"new_cursor_x == cols %d",&local_145);
  ::std::__cxx11::string::~string((string *)local_128);
  if (((pLVar3->pos != 0) && (pLVar3->pos == pLVar3->len)) && (new_cursor_x == (pLVar3->ws).ws_col))
  {
    ::std::__cxx11::string::string((string *)local_128,"<newline>",&local_145);
    ::std::__cxx11::string::~string((string *)local_128);
    ::std::__cxx11::string::append((char *)&append_buffer);
    ::std::__cxx11::string::append((char *)&append_buffer);
    lVar8 = (long)rows;
    new_cursor_row = new_cursor_row + 1;
    new_cursor_x = 0;
    iVar5 = (int)(lVar8 + 1U);
    bVar4 = (int)local_140->maxrows <= rows;
    rows = iVar5;
    if (bVar4) {
      local_140->maxrows = lVar8 + 1U;
    }
  }
  ::std::__cxx11::string::string((string *)local_128,"render %d rows (old rows %d)",&local_145);
  ::std::__cxx11::string::~string((string *)local_128);
  ::std::__cxx11::string::string((string *)local_128,"new_cursor_row %d",&local_145);
  ::std::__cxx11::string::~string((string *)local_128);
  ::std::__cxx11::string::string((string *)local_128,"new_cursor_x %d",&local_145);
  ::std::__cxx11::string::~string((string *)local_128);
  ::std::__cxx11::string::string((string *)local_128,"len %d",&local_145);
  ::std::__cxx11::string::~string((string *)local_128);
  ::std::__cxx11::string::string((string *)local_128,"old_cursor_rows %d",&local_145);
  ::std::__cxx11::string::~string((string *)local_128);
  ::std::__cxx11::string::string((string *)local_128,"pos %d",&local_145);
  ::std::__cxx11::string::~string((string *)local_128);
  ::std::__cxx11::string::string((string *)local_128,"max cols %d",&local_145);
  ::std::__cxx11::string::~string((string *)local_128);
  if (new_cursor_row < rows) {
    ::std::__cxx11::string::string((string *)local_128,"go-up %d",&local_145);
    ::std::__cxx11::string::~string((string *)local_128);
    snprintf(seq,0x40,"\x1b[%dA",(ulong)(uint)(rows - new_cursor_row));
    ::std::__cxx11::string::append((char *)&append_buffer);
  }
  iVar5 = new_cursor_x;
  ::std::__cxx11::string::string((string *)local_128,"set col %d",&local_145);
  ::std::__cxx11::string::~string((string *)local_128);
  if (iVar5 == 0) {
    seq[0] = '\r';
    seq[1] = '\0';
  }
  else {
    snprintf(seq,0x40,"\r\x1b[%dC",(ulong)(uint)iVar5);
  }
  ::std::__cxx11::string::append((char *)&append_buffer);
  ::std::__cxx11::string::string((string *)local_128,anon_var_dwarf_4b71d2e + 8,&local_145);
  ::std::__cxx11::string::~string((string *)local_128);
  local_140->old_cursor_rows = (long)new_cursor_row;
  AppendBuffer::Write(&append_buffer,fd);
  ::std::__cxx11::string::~string((string *)&append_buffer);
  ::std::_Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>::
  ~_Vector_base((_Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_> *)
                &tokens);
  ::std::__cxx11::string::~string((string *)&highlight_buffer);
  return;
}

Assistant:

void Linenoise::RefreshMultiLine() {
	if (!render) {
		return;
	}
	char seq[64];
	int plen = GetPromptWidth();
	// utf8 in prompt, get render width
	int rows, cols;
	int new_cursor_row, new_cursor_x;
	PositionToColAndRow(pos, new_cursor_row, new_cursor_x, rows, cols);
	int col; /* column position, zero-based. */
	int old_rows = maxrows ? maxrows : 1;
	int fd = ofd;
	std::string highlight_buffer;
	auto render_buf = this->buf;
	auto render_len = this->len;
	idx_t render_start = 0;
	idx_t render_end = render_len;
	if (clear_screen) {
		old_cursor_rows = 0;
		old_rows = 0;
		clear_screen = false;
	}
	if (rows > ws.ws_row) {
		// the text does not fit in the terminal (too many rows)
		// enable scrolling mode
		// check if, given the current y_scroll, the cursor is visible
		// display range is [y_scroll, y_scroll + ws.ws_row]
		if (new_cursor_row < int(y_scroll) + 1) {
			y_scroll = new_cursor_row - 1;
		} else if (new_cursor_row > int(y_scroll) + int(ws.ws_row)) {
			y_scroll = new_cursor_row - ws.ws_row;
		}
		// display only characters up to the current scroll position
		if (y_scroll == 0) {
			render_start = 0;
		} else {
			render_start = ColAndRowToPosition(y_scroll, 0);
		}
		if (int(y_scroll) + int(ws.ws_row) >= rows) {
			render_end = len;
		} else {
			render_end = ColAndRowToPosition(y_scroll + ws.ws_row, 99999);
		}
		new_cursor_row -= y_scroll;
		render_buf += render_start;
		render_len = render_end - render_start;
		Linenoise::Log("truncate to rows %d - %d (render bytes %d to %d)", y_scroll, y_scroll + ws.ws_row, render_start,
		               render_end);
		rows = ws.ws_row;
	} else {
		y_scroll = 0;
	}

	/* Update maxrows if needed. */
	if (rows > (int)maxrows) {
		maxrows = rows;
	}

	vector<highlightToken> tokens;
	if (Highlighting::IsEnabled()) {
		bool is_dot_command = buf[0] == '.';
		auto match = search_index < search_matches.size() ? &search_matches[search_index] : nullptr;
		tokens = Highlighting::Tokenize(render_buf, render_len, is_dot_command, match);

		// add error highlighting
		AddErrorHighlighting(render_start, render_end, tokens);

		// add completion hint
		if (AddCompletionMarker(render_buf, render_len, highlight_buffer, tokens)) {
			render_buf = (char *)highlight_buffer.c_str();
			render_len = highlight_buffer.size();
		}
	}
	if (rows > 1) {
		// add continuation markers
		highlight_buffer = AddContinuationMarkers(render_buf, render_len, plen,
		                                          y_scroll > 0 ? new_cursor_row + 1 : new_cursor_row, tokens);
		render_buf = (char *)highlight_buffer.c_str();
		render_len = highlight_buffer.size();
	}
	if (duckdb::Utf8Proc::IsValid(render_buf, render_len)) {
		if (Highlighting::IsEnabled()) {
			highlight_buffer = Highlighting::HighlightText(render_buf, render_len, 0, render_len, tokens);
			render_buf = (char *)highlight_buffer.c_str();
			render_len = highlight_buffer.size();
		}
	}

	/* First step: clear all the lines used before. To do so start by
	 * going to the last row. */
	AppendBuffer append_buffer;
	if (old_rows - old_cursor_rows > 0) {
		Linenoise::Log("go down %d", old_rows - old_cursor_rows);
		snprintf(seq, 64, "\x1b[%dB", old_rows - int(old_cursor_rows));
		append_buffer.Append(seq);
	}

	/* Now for every row clear it, go up. */
	for (int j = 0; j < old_rows - 1; j++) {
		Linenoise::Log("clear+up");
		append_buffer.Append("\r\x1b[0K\x1b[1A");
	}

	/* Clean the top line. */
	Linenoise::Log("clear");
	append_buffer.Append("\r\x1b[0K");

	/* Write the prompt and the current buffer content */
	if (y_scroll == 0) {
		append_buffer.Append(prompt);
	}
	append_buffer.Append(render_buf, render_len);

	/* Show hints if any. */
	RefreshShowHints(append_buffer, plen);

	/* If we are at the very end of the screen with our prompt, we need to
	 * emit a newline and move the prompt to the first column. */
	Linenoise::Log("pos > 0 %d", pos > 0 ? 1 : 0);
	Linenoise::Log("pos == len %d", pos == len ? 1 : 0);
	Linenoise::Log("new_cursor_x == cols %d", new_cursor_x == ws.ws_col ? 1 : 0);
	if (pos > 0 && pos == len && new_cursor_x == ws.ws_col) {
		Linenoise::Log("<newline>", 0);
		append_buffer.Append("\n");
		append_buffer.Append("\r");
		rows++;
		new_cursor_row++;
		new_cursor_x = 0;
		if (rows > (int)maxrows) {
			maxrows = rows;
		}
	}
	Linenoise::Log("render %d rows (old rows %d)", rows, old_rows);

	/* Move cursor to right position. */
	Linenoise::Log("new_cursor_row %d", new_cursor_row);
	Linenoise::Log("new_cursor_x %d", new_cursor_x);
	Linenoise::Log("len %d", len);
	Linenoise::Log("old_cursor_rows %d", old_cursor_rows);
	Linenoise::Log("pos %d", pos);
	Linenoise::Log("max cols %d", ws.ws_col);

	/* Go up till we reach the expected position. */
	if (rows - new_cursor_row > 0) {
		Linenoise::Log("go-up %d", rows - new_cursor_row);
		snprintf(seq, 64, "\x1b[%dA", rows - new_cursor_row);
		append_buffer.Append(seq);
	}

	/* Set column. */
	col = new_cursor_x;
	Linenoise::Log("set col %d", 1 + col);
	if (col) {
		snprintf(seq, 64, "\r\x1b[%dC", col);
	} else {
		snprintf(seq, 64, "\r");
	}
	append_buffer.Append(seq);

	Linenoise::Log("\n");
	old_cursor_rows = new_cursor_row;
	append_buffer.Write(fd);
}